

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Node * __thiscall wasm::DataFlow::Graph::makeConst(Graph *this,Literal *value)

{
  iterator iVar1;
  Const *pCVar2;
  Node *pNVar3;
  mapped_type *ppNVar4;
  Builder local_50;
  Builder builder;
  
  iVar1 = std::
          _Hashtable<wasm::Literal,_std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literal>,_std::hash<wasm::Literal>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->constantNodes)._M_h,value);
  if (iVar1.super__Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>.
      _M_cur == (__node_type *)0x0) {
    local_50.wasm = this->module;
    Literal::Literal((Literal *)&builder,value);
    pCVar2 = Builder::makeConst(&local_50,(Literal *)&builder);
    Literal::~Literal((Literal *)&builder);
    pNVar3 = (Node *)operator_new(0x30);
    pNVar3->type = Expr;
    (pNVar3->values).
    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar3->values).
    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar3->values).
    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pNVar3->field_1).expr = (Expression *)pCVar2;
    pNVar3->origin = (Expression *)pCVar2;
    pNVar3 = addNode(this,pNVar3);
    ppNVar4 = std::__detail::
              _Map_base<wasm::Literal,_std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literal>,_std::hash<wasm::Literal>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Literal,_std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literal>,_std::hash<wasm::Literal>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->constantNodes,value);
    *ppNVar4 = pNVar3;
  }
  else {
    pNVar3 = *(Node **)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>
                              ._M_cur + 0x20);
  }
  return pNVar3;
}

Assistant:

Node* makeConst(Literal value) {
    auto iter = constantNodes.find(value);
    if (iter != constantNodes.end()) {
      return iter->second;
    }
    // Create one for this literal.
    Builder builder(*module);
    auto* c = builder.makeConst(value);
    auto* ret = addNode(Node::makeExpr(c, c));
    constantNodes[value] = ret;
    return ret;
  }